

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_request_state(Curl_easy *data,_Bool *done)

{
  curl_off_t *pcVar1;
  connectdata *conn;
  smb_request *psVar2;
  char *pcVar3;
  char *__s;
  curl_off_t cVar4;
  undefined8 *puVar5;
  connectdata *pcVar6;
  void *pvVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  curl_pp_transfer cVar12;
  __pid_t _Var13;
  smb_request *req;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  uint uVar17;
  smb_request *req_1;
  ulong uVar18;
  long lVar19;
  short sVar20;
  size_t upload_size;
  void *msg;
  smb_tree_disconnect msg_1;
  void *local_478;
  _Bool *local_470;
  undefined1 local_464;
  undefined1 uStack_463;
  undefined1 local_462;
  undefined2 uStack_461;
  undefined1 uStack_45f;
  undefined1 uStack_45e;
  undefined1 uStack_45d;
  undefined1 uStack_45c;
  undefined1 uStack_45b;
  undefined1 uStack_45a;
  char acStack_459 [5];
  undefined2 uStack_454;
  undefined1 uStack_452;
  undefined1 uStack_451;
  undefined1 uStack_450;
  undefined4 uStack_44f;
  undefined1 uStack_44b;
  undefined1 uStack_44a;
  undefined5 uStack_449;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined2 uStack_442;
  int iStack_440;
  undefined1 uStack_43c;
  undefined8 uStack_43b;
  undefined2 local_433;
  char local_431 [1025];
  
  conn = data->conn;
  psVar2 = (data->req).p.smb;
  local_478 = (void *)0x0;
  if ((((data->state).field_0x776 & 2) != 0) && ((data->state).infilesize < 0)) {
    Curl_failf(data,"SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }
  if (psVar2->state == SMB_REQUESTING) {
    pcVar3 = (conn->host).name;
    local_470 = done;
    sVar14 = strlen(pcVar3);
    __s = (char *)(conn->proto).rtspc.buf.toobig;
    sVar15 = strlen(__s);
    uVar18 = sVar15 + sVar14 + 10;
    if (0x400 < uVar18) {
      CVar10 = CURLE_FILESIZE_EXCEEDED;
      goto LAB_00153d00;
    }
    uStack_45a = 0;
    local_462 = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    uStack_45e = 0;
    uStack_45d = 0;
    uStack_45c = 0;
    uStack_45b = 0;
    local_464 = 4;
    uStack_463 = 0xff;
    curl_msnprintf(acStack_459,uVar18,"\\\\%s\\%s%c%s",pcVar3,__s,0,"?????");
    uStack_45b = (undefined1)uVar18;
    uStack_45a = (undefined1)(uVar18 >> 8);
    CVar10 = smb_send_message(data,'u',&local_464,sVar15 + sVar14 + 0x15);
    if (CVar10 != CURLE_OK) goto LAB_00153d00;
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
    done = local_470;
  }
  CVar10 = smb_send_and_recv(data,&local_478);
  pvVar7 = local_478;
  if ((CVar10 != CURLE_OK) && (CVar10 != CURLE_AGAIN)) {
LAB_00153d00:
    Curl_conncontrol(conn,1);
    return CVar10;
  }
  CVar10 = CURLE_OK;
  if (local_478 == (void *)0x0) {
    return CURLE_OK;
  }
  switch(psVar2->state) {
  case SMB_TREE_CONNECT:
    if (*(int *)((long)local_478 + 9) == 0) {
      psVar2->tid = *(unsigned_short *)((long)local_478 + 0x1c);
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
      pcVar3 = ((data->req).p.file)->freepath;
      sVar14 = strlen(pcVar3);
      CVar11 = CURLE_FILESIZE_EXCEEDED;
      if (sVar14 + 1 < 0x401) {
        local_462 = 0;
        uStack_461 = 0;
        uStack_45f = 0;
        uStack_45c = 0;
        uStack_45b = 0;
        uStack_45a = 0;
        acStack_459[0] = '\0';
        acStack_459[1] = '\0';
        acStack_459[2] = '\0';
        acStack_459[3] = '\0';
        acStack_459[4] = 0;
        uStack_43c = 0;
        uStack_43b = 0;
        uStack_450 = 0;
        uStack_44f = 0;
        uStack_44b = 0;
        uStack_44a = 0;
        uStack_449 = 0;
        local_464 = 0x18;
        uStack_463 = 0xff;
        uStack_45e = (undefined1)sVar14;
        uStack_45d = (undefined1)(sVar14 >> 8);
        uStack_444 = 7;
        uStack_443 = 0;
        uStack_442 = 0;
        uVar17 = *(uint *)&(data->state).field_0x774 >> 0x11 & 1;
        iStack_440 = uVar17 * 4 + 1;
        uStack_454 = 0;
        uStack_452 = 0;
        uStack_451 = (undefined1)((uVar17 - 2) * 0x40000000 >> 0x18);
        local_433 = (undefined2)(sVar14 + 1);
        strcpy(local_431,pcVar3);
        CVar11 = smb_send_message(data,0xa2,&local_464,sVar14 + 0x34);
      }
      cVar12 = PPTRANSFER_NONE;
      goto LAB_00154201;
    }
    CVar11 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (*(int *)((long)local_478 + 9) == 0x50001) {
      CVar11 = CURLE_REMOTE_ACCESS_DENIED;
    }
    psVar2->result = CVar11;
    break;
  case SMB_OPEN:
    if ((*(int *)((long)local_478 + 9) == 0) && (99 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      psVar2->fid = *(unsigned_short *)((long)local_478 + 0x2a);
      (data->req).offset = 0;
      if (((data->state).field_0x776 & 2) != 0) {
        cVar4 = (data->state).infilesize;
        (data->req).size = cVar4;
        Curl_pgrsSetUploadSize(data,cVar4);
        lVar19 = (data->req).size;
        lVar16 = (data->req).bytecount;
LAB_00154017:
        upload_size = lVar19 - lVar16;
        (conn->proto).ftpc.pp.sendbuf.toobig = 0;
        psVar2 = (data->req).p.smb;
        cVar4 = (data->req).offset;
        puVar5 = (undefined8 *)(data->conn->proto).ftpc.pp.response_time;
        if (0x7ffe < (long)upload_size) {
          upload_size = 0x7fff;
        }
        puVar5[4] = 0;
        puVar5[5] = 0;
        *(undefined4 *)(puVar5 + 8) = 0;
        puVar5[6] = 0;
        puVar5[7] = 0;
        puVar5[2] = 0;
        puVar5[3] = 0;
        *puVar5 = 0;
        puVar5[1] = 0;
        *(undefined2 *)((long)puVar5 + 0x24) = 0xff0e;
        *(unsigned_short *)((long)puVar5 + 0x29) = psVar2->fid;
        *(int *)((long)puVar5 + 0x2b) = (int)cVar4;
        *(int *)((long)puVar5 + 0x3d) = (int)((ulong)cVar4 >> 0x20);
        sVar20 = (short)upload_size;
        *(short *)((long)puVar5 + 0x39) = sVar20;
        *(undefined2 *)((long)puVar5 + 0x3b) = 0x40;
        *(short *)((long)puVar5 + 0x41) = sVar20 + 1;
        pcVar6 = data->conn;
        psVar2 = (data->req).p.smb;
        *puVar5 = 0;
        puVar5[1] = 0;
        *(undefined4 *)(puVar5 + 4) = 0;
        puVar5[2] = 0;
        puVar5[3] = 0;
        *(ushort *)((long)puVar5 + 2) = (sVar20 + 0x40U) * 0x100 | (ushort)(sVar20 + 0x40U) >> 8;
        *(undefined4 *)((long)puVar5 + 4) = 0x424d53ff;
        *(undefined1 *)(puVar5 + 1) = 0x2f;
        *(undefined1 *)((long)puVar5 + 0xd) = 0x18;
        *(undefined2 *)((long)puVar5 + 0xe) = 0x41;
        *(unsigned_short *)(puVar5 + 4) = (pcVar6->proto).smbc.uid;
        *(unsigned_short *)((long)puVar5 + 0x1c) = psVar2->tid;
        _Var13 = getpid();
        *(short *)(puVar5 + 2) = (short)((uint)_Var13 >> 0x10);
        *(short *)((long)puVar5 + 0x1e) = (short)_Var13;
        CVar11 = smb_send(data,0x44,upload_size);
        cVar12 = 4;
        goto LAB_00154201;
      }
      lVar19 = *(long *)((long)local_478 + 0x5c);
      (data->req).size = lVar19;
      if (-1 < lVar19) {
        Curl_pgrsSetDownloadSize(data,lVar19);
        if (((data->set).field_0x8ca & 0x80) != 0) {
          (data->info).filetime = (*(long *)((long)pvVar7 + 0x48) + -0x19db1ded53e8000) / 10000000;
        }
LAB_00154141:
        (conn->proto).ftpc.pp.sendbuf.toobig = 0;
        cVar4 = (data->req).offset;
        uStack_452 = 0;
        uStack_451 = 0;
        uStack_450 = 0;
        uStack_44b = 0;
        uStack_44a = 0;
        local_462 = 0;
        uStack_461 = 0;
        acStack_459[4] = 0;
        uStack_454 = 0;
        local_464 = 0xc;
        uStack_463 = 0xff;
        uVar8 = ((data->req).p.smb)->fid;
        uStack_45f = (undefined1)uVar8;
        uStack_45e = (undefined1)(uVar8 >> 8);
        uStack_45d = (undefined1)cVar4;
        uStack_45c = (undefined1)((ulong)cVar4 >> 8);
        uStack_45b = (undefined1)((ulong)cVar4 >> 0x10);
        uStack_45a = (undefined1)((ulong)cVar4 >> 0x18);
        uStack_44f = (undefined4)((ulong)cVar4 >> 0x20);
        acStack_459[0] = '\0';
        acStack_459[1] = -0x80;
        acStack_459[2] = '\0';
        acStack_459[3] = -0x80;
        CVar11 = smb_send_message(data,'.',&local_464,0x1b);
        cVar12 = PPTRANSFER_NONE|PPTRANSFER_INFO;
        goto LAB_00154201;
      }
      CVar11 = CURLE_WEIRD_SERVER_REPLY;
      goto LAB_001541af;
    }
    CVar11 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (*(int *)((long)local_478 + 9) == 0x50001) {
      CVar11 = CURLE_REMOTE_ACCESS_DENIED;
    }
    psVar2->result = CVar11;
  case SMB_CLOSE:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    local_462 = 0;
    local_464 = 0;
    uStack_463 = 0;
    CVar11 = smb_send_message(data,'q',&local_464,3);
    cVar12 = 6;
    goto LAB_00154201;
  case SMB_DOWNLOAD:
    CVar11 = CURLE_RECV_ERROR;
    if ((*(int *)((long)local_478 + 9) != 0) || ((conn->proto).ftpc.pp.sendbuf.toobig < 0x32))
    goto LAB_001541af;
    uVar8 = Curl_read16_le((uchar *)((long)local_478 + 0x2f));
    uVar9 = Curl_read16_le((uchar *)((long)pvVar7 + 0x31));
    if (uVar8 != 0) {
      uVar18 = (ulong)uVar8;
      if ((conn->proto).ftpc.pp.sendbuf.toobig < uVar18 + uVar9 + 4) {
        Curl_failf(data,"Invalid input packet");
      }
      else {
        CVar11 = Curl_client_write(data,1,(char *)((long)pvVar7 + (ulong)uVar9 + 4),uVar18);
        if (CVar11 == CURLE_OK) {
          pcVar1 = &(data->req).offset;
          *pcVar1 = *pcVar1 + uVar18;
          if ((short)uVar8 < 0) goto LAB_00154141;
          goto LAB_001541b8;
        }
      }
      goto LAB_001541af;
    }
    goto LAB_001541b8;
  case SMB_UPLOAD:
    CVar11 = CURLE_UPLOAD_FAILED;
    if ((*(int *)((long)local_478 + 9) == 0) && (0x29 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      uVar8 = Curl_read16_le((uchar *)((long)local_478 + 0x29));
      lVar19 = (data->req).bytecount + (ulong)uVar8;
      (data->req).bytecount = lVar19;
      pcVar1 = &(data->req).offset;
      *pcVar1 = *pcVar1 + (ulong)uVar8;
      Curl_pgrsSetUploadCounter(data,lVar19);
      lVar19 = (data->req).size;
      lVar16 = (data->req).bytecount;
      if (lVar16 < lVar19) goto LAB_00154017;
      goto LAB_001541b8;
    }
LAB_001541af:
    psVar2->result = CVar11;
LAB_001541b8:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    uStack_45d = 0;
    uStack_45c = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    uStack_45e = 0;
    local_464 = 3;
    uVar8 = ((data->req).p.smb)->fid;
    uStack_463 = (undefined1)uVar8;
    local_462 = (undefined1)(uVar8 >> 8);
    CVar11 = smb_send_message(data,'\x04',&local_464,9);
    cVar12 = 5;
    goto LAB_00154201;
  case SMB_TREE_DISCONNECT:
    CVar11 = psVar2->result;
    break;
  default:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    return CURLE_OK;
  }
  (conn->proto).ftpc.pp.sendbuf.toobig = 0;
  *done = true;
  cVar12 = 7;
LAB_00154201:
  if (CVar11 == CURLE_OK) {
    ((data->req).p.imap)->transfer = cVar12;
  }
  else {
    Curl_conncontrol(conn,1);
    CVar10 = CVar11;
  }
  return CVar10;
}

Assistant:

static CURLcode smb_request_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_request *req = data->req.p.smb;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  if(data->state.upload && (data->state.infilesize < 0)) {
    failf(data, "SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(data);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(data, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    data->req.offset = 0;
    if(data->state.upload) {
      data->req.size = data->state.infilesize;
      Curl_pgrsSetUploadSize(data, data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      data->req.size = smb_swap64(smb_m->end_of_file);
      if(data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(data, data->req.size);
        if(data->set.get_filetime)
          get_posix_time(&data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    data->req.offset += len;
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetUploadCounter(data, data->req.bytecount);
    if(data->req.bytecount >= data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We do not care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(data);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(data);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(data);
    break;

  case SMB_CLOSE:
    result = smb_send_close(data);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(data);
    break;

  case SMB_DONE:
    result = req->result;
    *done = TRUE;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(data, next_state);

  return CURLE_OK;
}